

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

float rsg::ConstructorOp::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  VariableType *pVVar4;
  ShaderParameters *pSVar5;
  GeneratorState *state_local;
  
  pVVar4 = ConstValueRangeAccess::getType(&valueRange);
  bVar1 = VariableType::isVoid(pVVar4);
  if (bVar1) {
    state_local._4_4_ = 0.05;
  }
  else {
    pVVar4 = ConstValueRangeAccess::getType(&valueRange);
    bVar1 = VariableType::isFloatOrVec(pVVar4);
    if (!bVar1) {
      pVVar4 = ConstValueRangeAccess::getType(&valueRange);
      bVar1 = VariableType::isIntOrVec(pVVar4);
      if (!bVar1) {
        pVVar4 = ConstValueRangeAccess::getType(&valueRange);
        bVar1 = VariableType::isBoolOrVec(pVVar4);
        if (!bVar1) {
          return 0.0;
        }
      }
    }
    iVar2 = GeneratorState::getExpressionDepth(state);
    pVVar4 = ConstValueRangeAccess::getType(&valueRange);
    iVar3 = getTypeConstructorDepth(pVVar4);
    pSVar5 = GeneratorState::getShaderParameters(state);
    if (pSVar5->maxExpressionDepth < iVar2 + iVar3) {
      state_local._4_4_ = 0.0;
    }
    else {
      state_local._4_4_ = 1.0;
    }
  }
  return state_local._4_4_;
}

Assistant:

float ConstructorOp::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (valueRange.getType().isVoid())
		return unusedValueWeight;

	if (!valueRange.getType().isFloatOrVec() && !valueRange.getType().isIntOrVec() && !valueRange.getType().isBoolOrVec())
		return 0.0f;

	if (state.getExpressionDepth() + getTypeConstructorDepth(valueRange.getType()) > state.getShaderParameters().maxExpressionDepth)
		return 0.0f;

	return 1.0f;
}